

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext_api.cc
# Opt level: O0

int GetNN(void *hPtr,char *input,char ***predictedNeighbors,float *predictedProbabilities,int n)

{
  undefined1 auVar1 [16];
  bool bVar2;
  size_type sVar3;
  ulong uVar4;
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pvVar5;
  pointer ppVar6;
  reference pvVar7;
  FastText *in_RCX;
  undefined8 *in_RDX;
  char *in_RSI;
  allocator<char> *in_RDI;
  int in_R8D;
  double dVar8;
  undefined1 auVar9 [16];
  size_type len;
  int i;
  char **labels;
  int length;
  exception *e;
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  predictions;
  FastTextWrapper *fastText;
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffed8;
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffee0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  int local_dc;
  undefined1 local_89 [57];
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_50;
  allocator<char> *paVar10;
  undefined4 in_stack_ffffffffffffffd0;
  int local_4;
  int32_t k;
  
  std::
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)0x1f2dec);
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_89;
  paVar10 = in_RDI;
  std::allocator<char>::allocator();
  k = (int32_t)((ulong)paVar10 >> 0x20);
  std::__cxx11::string::string<std::allocator<char>>(this,in_RSI,in_RDI);
  fasttext::FastText::getNN(in_RCX,(string *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0),k);
  std::
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator=(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  std::
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(in_stack_fffffffffffffee0);
  std::__cxx11::string::~string((string *)(local_89 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_89);
  bVar2 = std::
          vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::empty(in_stack_fffffffffffffee0);
  if (bVar2) {
    local_4 = 0;
  }
  else {
    sVar3 = std::
            vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::size(&local_50);
    auVar9._8_4_ = (int)(sVar3 >> 0x20);
    auVar9._0_8_ = sVar3;
    auVar9._12_4_ = 0x45300000;
    dVar8 = (auVar9._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0);
    if ((double)in_R8D <= dVar8) {
      dVar8 = (double)in_R8D;
    }
    local_4 = (int)dVar8;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)local_4;
    uVar4 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    uVar4 = -(ulong)((long)local_4 == 0) | uVar4;
    pvVar5 = (vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)operator_new__(uVar4);
    (pvVar5->
    super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    memset(&(pvVar5->
            super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish,0,uVar4 - 8);
    in_stack_fffffffffffffee0 = pvVar5;
    for (local_dc = 0; local_dc < local_4; local_dc = local_dc + 1) {
      std::
      vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[](&local_50,(long)local_dc);
      uVar4 = std::__cxx11::string::length();
      ppVar6 = (pointer)operator_new__(uVar4 + 1);
      (&(pvVar5->
        super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start)[local_dc] = ppVar6;
      pvVar7 = std::
               vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&local_50,(long)local_dc);
      std::__cxx11::string::copy
                ((char *)&pvVar7->second,
                 (ulong)(&(pvVar5->
                          super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start)[local_dc],uVar4);
      *(undefined1 *)
       ((long)&(&(pvVar5->
                 super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start)[local_dc]->first + uVar4) = 0;
      pvVar7 = std::
               vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&local_50,(long)local_dc);
      *(float *)((long)&(in_RCX->args_).
                        super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                (long)local_dc * 4) = pvVar7->first;
    }
    *in_RDX = pvVar5;
  }
  std::
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(in_stack_fffffffffffffee0);
  return local_4;
}

Assistant:

GetNN(void* hPtr, const char* input, char*** predictedNeighbors, float* predictedProbabilities, const int n)
{
    auto fastText = static_cast<FastTextWrapper*>(hPtr);
    std::vector<std::pair<real, std::string>> predictions;

    try {
        predictions = fastText->getNN(input, n);

        if (predictions.empty()) {
            return 0;
        }
    }
    catch (std::exception& e) {
        _lastError = std::string(e.what());
        return -1;
    }
    catch (...) {
        _lastError = "Unknown error";
        return -1;
    }

    int length = fmin(predictions.size(), n);
    auto labels = new char* [length] {nullptr};
    for (auto i = 0; i<length; ++i) {
        const auto len = predictions[i].second.length();
        labels[i] = new char[len+1];
        predictions[i].second.copy(labels[i], len);
        labels[i][len] = '\0';
        predictedProbabilities[i] = predictions[i].first;
    }

    *(predictedNeighbors) = labels;

    return length;
}